

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall RenderTarget::RenderTarget(RenderTarget *this)

{
  RenderTarget *this_local;
  
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::vector(&this->objects);
  std::vector<nite::Program,_std::allocator<nite::Program>_>::vector(&this->programs);
  clear(this);
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::reserve
            (&this->objects,0x8000);
  return;
}

Assistant:

RenderTarget(){
		clear();
		objects.reserve(32768);
	}